

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Vector<float,_3> __thiscall tcu::operator*(tcu *this,Vector<float,_3> *vec,Matrix<float,_3,_3> *mtx)

{
  float *pfVar1;
  long lVar2;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  float in_XMM1_Da;
  Vector<float,_3> VVar4;
  int local_2c;
  float local_28;
  int row;
  float v;
  int col;
  Matrix<float,_3,_3> *mtx_local;
  Vector<float,_3> *vec_local;
  Vector<float,_3> *res;
  
  Vector<float,_3>::Vector((Vector<float,_3> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (row = 0; row < 3; row = row + 1) {
    local_28 = 0.0;
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      pfVar1 = Matrix<float,_3,_3>::operator()(mtx,local_2c,row);
      lVar2 = (long)local_2c;
      in_XMM1_Da = local_28;
      local_28 = *pfVar1 * vec->m_data[lVar2] + local_28;
    }
    uVar3 = (ulong)(uint)local_28;
    *(float *)(this + (long)row * 4) = local_28;
  }
  VVar4.m_data[2] = in_XMM1_Da;
  VVar4.m_data[0] = (float)(int)uVar3;
  VVar4.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_3>)VVar4.m_data;
}

Assistant:

Vector<T, Cols> operator* (const Vector<T, Rows>& vec, const Matrix<T, Rows, Cols>& mtx)
{
	Vector<T, Cols> res;
	for (int col = 0; col < Cols; col++)
	{
		T v = T(0);
		for (int row = 0; row < Rows; row++)
			v += mtx(row,col) * vec.m_data[row];
		res.m_data[col] = v;
	}
	return res;
}